

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O0

int mat_lu(MATRIX A,MATRIX P)

{
  double dVar1;
  int iVar2;
  int p;
  double c1;
  double c;
  int tmp;
  int maxi;
  int n;
  int k;
  int j;
  int i;
  MATRIX P_local;
  MATRIX A_local;
  
  iVar2 = *(int *)((long)A + -4);
  p = 0;
  for (i = 0; i < iVar2; i = i + 1) {
    *P[i] = (double)i;
  }
  k = 0;
  while( true ) {
    if (iVar2 <= k) {
      return p;
    }
    maxi = k;
    c = 0.0;
    for (i = k; i < iVar2; i = i + 1) {
      if (c < ABS(A[(int)*P[i]][k])) {
        maxi = i;
        c = ABS(A[(int)*P[i]][k]);
      }
    }
    if (k != maxi) {
      p = p + 1;
      dVar1 = *P[k];
      *P[k] = *P[maxi];
      *P[maxi] = (double)(int)dVar1;
    }
    i = k;
    if ((A[(int)*P[k]][k] == 0.0) && (!NAN(A[(int)*P[k]][k]))) break;
    while (i = i + 1, i < iVar2) {
      A[(int)*P[i]][k] = A[(int)*P[i]][k] / A[(int)*P[k]][k];
      j = k;
      while (j = j + 1, j < iVar2) {
        A[(int)*P[i]][j] = -A[(int)*P[i]][k] * A[(int)*P[k]][j] + A[(int)*P[i]][j];
      }
    }
    k = k + 1;
  }
  return -1;
}

Assistant:

int mat_lu( MATRIX A, MATRIX P )
{
	int	i, j, k, n;
	int	maxi, tmp;
	double	c, c1;
	int	p;

	n = MatCol(A);

	for (p=0,i=0; i<n; i++)
		{
		P[i][0] = i;
		}

	for (k=0; k<n; k++)
	{
	/*
	* --- partial pivoting ---
	*/
	for (i=k, maxi=k, c=0.0; i<n; i++)
		{
		c1 = fabs( A[(int)P[i][0]][k] );
		if (c1 > c)
			{
			c = c1;
			maxi = i;
			}
		}

	/*
	*	row exchange, update permutation vector
	*/
	if (k != maxi)
		{
		p++;
		tmp = P[k][0];
		P[k][0] = P[maxi][0];
		P[maxi][0] = tmp;
		}

	/*
	*	suspected singular matrix
	*/
	if ( A[(int)P[k][0]][k] == 0.0 )
		return (-1);

	for (i=k+1; i<n; i++)
		{
		/*
		* --- calculate m(i,j) ---
		*/
		A[(int)P[i][0]][k] = A[(int)P[i][0]][k] / A[(int)P[k][0]][k];

		/*
		* --- elimination ---
		*/
		for (j=k+1; j<n; j++)
			{
			A[(int)P[i][0]][j] -= A[(int)P[i][0]][k] * A[(int)P[k][0]][j];
			}
		}
	}

	return (p);
}